

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

object * parameter(object *fp)

{
  int cl;
  item *x;
  
  x = (item *)calloc(1,0x30);
  if (currentSymbol == 0x1f7) {
    loadStringLiteralToHeap(x);
    x->lev = fp->lev;
    getSymbol();
  }
  else {
    simpleExpression(x);
  }
  cl = fp->cl;
  if ((cl != 0x2c5) && ((cl != 0x2c1 || (fp->val < 1)))) {
    mark("parameter error resulting from prototype or declaration");
    exit(-1);
  }
  emitParameter(x,fp->typeIndex,cl);
  return fp->next;
}

Assistant:

object *parameter(struct object *fp) {
	variable int r; variable int i;
	variable bool cond;
	variable struct item *x;
	variable struct typeDesc *type;
	x = NULL; cond = false; type = NULL; r = 0; i = 0;
	allocMem(x);
	if (currentSymbol == SYMBOL_STRINGLITERAL) {
		loadStringLiteralToHeap(x);
		x->lev = fp->lev;
		getSymbol();
	} else {
		simpleExpression(x);
	}
	cond = isParameter(fp);
	if (cond == true) {
		emitParameter(x,fp->typeIndex,fp->cl);
		fp = fp->next;
	} else {
		mark("parameter error resulting from prototype or declaration");
		exit(-1);
	}
	return fp;
}